

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

bool QObject::disconnect(QObject *sender,QMetaMethod *signal,QObject *receiver,QMetaMethod *method)

{
  bool bVar1;
  MethodType MVar2;
  char *pcVar3;
  char *pcVar4;
  long *in_RCX;
  QObject *in_RDX;
  QMetaMethod *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int dummy;
  int method_index;
  int signal_index;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  QMetaMethod *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  QMetaMethod *in_stack_fffffffffffffde8;
  QObject *in_stack_fffffffffffffdf0;
  void **in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  QMessageLogger local_118;
  undefined4 local_f4;
  int local_f0;
  int local_ec;
  DisconnectType in_stack_ffffffffffffff40;
  QMessageLogger local_98;
  QMessageLogger local_78;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI == (long *)0x0) || ((in_RDX == (QObject *)0x0 && (*in_RCX != 0)))) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcConnect();
    anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f4c4b);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                 (char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (char *)0x3f4c64);
      QMessageLogger::warning(&local_78,"QObject::disconnect: Unexpected nullptr parameter");
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    bVar1 = false;
  }
  else if (((((Data *)&in_RSI->mobj)->superdata).direct == (QMetaObject *)0x0) ||
          (MVar2 = QMetaMethod::methodType
                             ((QMetaMethod *)
                              CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)),
          MVar2 == Signal)) {
    if ((*in_RCX == 0) ||
       (MVar2 = QMetaMethod::methodType
                          ((QMetaMethod *)
                           CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)),
       MVar2 != Constructor)) {
      local_ec = -0x55555556;
      local_f0 = -0x55555556;
      local_f4 = 0xaaaaaaaa;
      QMetaObjectPrivate::memberIndexes
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                 (int *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                 (int *)in_stack_fffffffffffffdd8);
      QMetaObjectPrivate::memberIndexes
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                 (int *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                 (int *)in_stack_fffffffffffffdd8);
      if (((((Data *)&in_RSI->mobj)->superdata).direct == (QMetaObject *)0x0) || (local_ec != -1)) {
        if ((in_RDX == (QObject *)0x0) || ((*in_RCX == 0 || (local_f0 != -1)))) {
          bVar1 = QMetaObjectPrivate::disconnect
                            ((QObject *)
                             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                             (int)((ulong)in_RDI >> 0x20),(QMetaObject *)in_RSI,in_RDX,
                             (int)((ulong)in_RCX >> 0x20),in_stack_fffffffffffffe68,
                             in_stack_ffffffffffffff40);
          if (bVar1) {
            bVar1 = QMetaMethod::isValid(in_RSI);
            if (!bVar1) {
              (**(code **)(*in_RDI + 0x58))(in_RDI,in_RSI);
            }
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        }
        else {
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          local_50 = &DAT_aaaaaaaaaaaaaaaa;
          lcConnect();
          anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (QLoggingCategory *)
                     CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_58), bVar1) {
            anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f519a);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)
                       CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                       (char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                       (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (char *)0x3f51b1);
            QMetaMethod::methodSignature(in_stack_fffffffffffffdd8);
            pcVar3 = QByteArray::constData((QByteArray *)0x3f51d5);
            (**in_RDX->_vptr_QObject)();
            pcVar4 = QMetaObject::className
                               ((QMetaObject *)
                                CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
            QMessageLogger::warning
                      ((QMessageLogger *)&stack0xfffffffffffffeb0,
                       "QObject::disconnect: method %s not found on class %s",pcVar3,pcVar4);
            QByteArray::~QByteArray((QByteArray *)0x3f5231);
            local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
          }
          bVar1 = false;
        }
      }
      else {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        lcConnect();
        anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                   CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
                  );
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_48), bVar1) {
          anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f503a);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0)
                     ,(char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                     (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (char *)0x3f5051);
          QMetaMethod::methodSignature(in_stack_fffffffffffffdd8);
          pcVar3 = QByteArray::constData((QByteArray *)0x3f5075);
          (**(code **)*in_RDI)();
          pcVar4 = QMetaObject::className
                             ((QMetaObject *)
                              CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
          QMessageLogger::warning
                    (&local_118,"QObject::disconnect: signal %s not found on class %s",pcVar3,pcVar4
                    );
          QByteArray::~QByteArray((QByteArray *)0x3f50d1);
          local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
        }
        bVar1 = false;
      }
    }
    else {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      lcConnect();
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
        anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f4e86);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                   (char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                   (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   (char *)0x3f4ea6);
        (**in_RDX->_vptr_QObject)();
        pcVar3 = QMetaObject::className
                           ((QMetaObject *)
                            CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        QMetaMethod::methodSignature(in_stack_fffffffffffffdd8);
        pcVar4 = QByteArray::constData((QByteArray *)0x3f4ee7);
        QMessageLogger::warning
                  ((QMessageLogger *)&stack0xffffffffffffff30,
                   "QObject::disconnect: cannot use constructor as argument %s::%s",pcVar3,pcVar4);
        QByteArray::~QByteArray((QByteArray *)0x3f4f13);
        local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
      }
      bVar1 = false;
    }
  }
  else {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    lcConnect();
    anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f4d0f);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                 (char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (char *)0x3f4d35);
      (**(code **)*in_RDI)();
      pcVar3 = QMetaObject::className
                         ((QMetaObject *)
                          CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      QMetaMethod::methodSignature(in_stack_fffffffffffffdd8);
      pcVar4 = QByteArray::constData((QByteArray *)0x3f4d7f);
      QMessageLogger::warning
                (&local_98,"QObject::%s: Attempt to %s non-signal %s::%s","disconnect","unbind",
                 pcVar3,pcVar4);
      QByteArray::~QByteArray((QByteArray *)0x3f4dc2);
      local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
    }
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QObject::disconnect(const QObject *sender, const QMetaMethod &signal,
                         const QObject *receiver, const QMetaMethod &method)
{
    if (sender == nullptr || (receiver == nullptr && method.mobj != nullptr)) {
        qCWarning(lcConnect, "QObject::disconnect: Unexpected nullptr parameter");
        return false;
    }
    if (signal.mobj) {
        if (signal.methodType() != QMetaMethod::Signal) {
            qCWarning(lcConnect, "QObject::%s: Attempt to %s non-signal %s::%s",
                     "disconnect","unbind",
                     sender->metaObject()->className(), signal.methodSignature().constData());
            return false;
        }
    }
    if (method.mobj) {
        if (method.methodType() == QMetaMethod::Constructor) {
            qCWarning(lcConnect, "QObject::disconnect: cannot use constructor as argument %s::%s",
                      receiver->metaObject()->className(), method.methodSignature().constData());
            return false;
        }
    }

    int signal_index;
    int method_index;
    {
        int dummy;
        QMetaObjectPrivate::memberIndexes(sender, signal, &signal_index, &dummy);
        QMetaObjectPrivate::memberIndexes(receiver, method, &dummy, &method_index);
    }
    // If we are here sender is not nullptr. If signal is not nullptr while signal_index
    // is -1 then this signal is not a member of sender.
    if (signal.mobj && signal_index == -1) {
        qCWarning(lcConnect, "QObject::disconnect: signal %s not found on class %s",
                  signal.methodSignature().constData(), sender->metaObject()->className());
        return false;
    }
    // If this condition is true then method is not a member of receiver.
    if (receiver && method.mobj && method_index == -1) {
        qCWarning(lcConnect, "QObject::disconnect: method %s not found on class %s",
                  method.methodSignature().constData(), receiver->metaObject()->className());
        return false;
    }

    if (!QMetaObjectPrivate::disconnect(sender, signal_index, signal.mobj, receiver, method_index, nullptr))
        return false;

    if (!signal.isValid()) {
        // The signal is a wildcard, meaning all signals were disconnected.
        // QMetaObjectPrivate::disconnect() doesn't call disconnectNotify()
        // per connection in this case. Call it once now, with an invalid
        // QMetaMethod as argument, as documented.
        const_cast<QObject *>(sender)->disconnectNotify(signal);
    }
    return true;
}